

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::framebufferTexture2D
          (ReferenceContext *this,deUint32 target,deUint32 attachment,deUint32 textarget,
          deUint32 texture,int level)

{
  deBool dVar1;
  Type TVar2;
  deUint32 dVar3;
  TestError *this_00;
  Framebuffer *local_90;
  int local_7c;
  AttachmentType AStack_78;
  int ndx_1;
  TexTarget local_70;
  int iStack_6c;
  int local_68;
  int local_64;
  Attachment *pAStack_60;
  int ndx;
  Attachment *fboAttachment;
  int local_44;
  Framebuffer *pFStack_40;
  int bindingRefCount;
  Framebuffer *framebufferBinding;
  Texture *pTStack_30;
  TexTarget fboTexTarget;
  Texture *texObj;
  AttachmentPoint point;
  int level_local;
  deUint32 texture_local;
  deUint32 textarget_local;
  deUint32 attachment_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  texObj._4_4_ = level;
  point = texture;
  level_local = textarget;
  texture_local = attachment;
  textarget_local = target;
  _attachment_local = this;
  if (attachment == 0x821a) {
    (*(this->super_Context)._vptr_Context[0x1e])
              (this,(ulong)target,0x8d00,(ulong)textarget,(ulong)texture,(ulong)(uint)level);
    (*(this->super_Context)._vptr_Context[0x1e])
              (this,(ulong)textarget_local,0x8d20,(ulong)(uint)level_local,(ulong)point,
               (ulong)texObj._4_4_);
  }
  else {
    texObj._0_4_ = mapGLAttachmentPoint(attachment);
    pTStack_30 = (Texture *)0x0;
    framebufferBinding._4_4_ = mapGLFboTexTarget(level_local);
    do {
      if (((textarget_local != 0x8d40) && (textarget_local != 0x8ca9)) &&
         (textarget_local != 0x8ca8)) {
        setError(this,0x500);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    do {
      if ((AttachmentPoint)texObj == ATTACHMENTPOINT_LAST) {
        setError(this,0x500);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    if ((textarget_local == 0x8d40) || (textarget_local == 0x8ca9)) {
      local_90 = this->m_drawFramebufferBinding;
    }
    else {
      local_90 = this->m_readFramebufferBinding;
    }
    pFStack_40 = local_90;
    do {
      if (pFStack_40 == (Framebuffer *)0x0) {
        setError(this,0x502);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    local_44 = (uint)(pFStack_40 == this->m_drawFramebufferBinding) +
               (uint)(pFStack_40 == this->m_readFramebufferBinding);
    if (point != ATTACHMENTPOINT_COLOR0) {
      pTStack_30 = rc::ObjectManager<sglr::rc::Texture>::find(&this->m_textures,point);
      do {
        if (pTStack_30 == (Texture *)0x0) {
          setError(this,0x502);
          return;
        }
        dVar1 = ::deGetFalse();
      } while (dVar1 != 0);
      do {
        if (texObj._4_4_ != 0) {
          setError(this,0x501);
          return;
        }
        dVar1 = ::deGetFalse();
      } while (dVar1 != 0);
      TVar2 = rc::Texture::getType(pTStack_30);
      if (TVar2 == TYPE_2D) {
        do {
          if (framebufferBinding._4_4_ != TEXTARGET_2D) {
            setError(this,0x502);
            return;
          }
          dVar1 = ::deGetFalse();
        } while (dVar1 != 0);
      }
      else {
        do {
          dVar1 = ::deGetFalse();
          if ((dVar1 != 0) || (TVar2 = rc::Texture::getType(pTStack_30), TVar2 != TYPE_CUBE_MAP)) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,(char *)0x0,"texObj->getType() == Texture::TYPE_CUBE_MAP",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                       ,0x7d7);
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          dVar1 = ::deGetFalse();
        } while (dVar1 != 0);
        dVar1 = deInRange32(framebufferBinding._4_4_,1,6);
        if (dVar1 == 0) {
          setError(this,0x502);
          return;
        }
      }
    }
    pAStack_60 = rc::Framebuffer::getAttachment(pFStack_40,(AttachmentPoint)texObj);
    for (local_64 = 0; local_64 < local_44; local_64 = local_64 + 1) {
      releaseFboAttachmentReference(this,pAStack_60);
    }
    rc::Framebuffer::Attachment::Attachment((Attachment *)&stack0xffffffffffffff88);
    pAStack_60->type = AStack_78;
    pAStack_60->name = ndx_1;
    pAStack_60->texTarget = local_70;
    pAStack_60->level = iStack_6c;
    pAStack_60->layer = local_68;
    if (pTStack_30 != (Texture *)0x0) {
      pAStack_60->type = ATTACHMENTTYPE_TEXTURE;
      dVar3 = rc::NamedObject::getName(&pTStack_30->super_NamedObject);
      pAStack_60->name = dVar3;
      pAStack_60->texTarget = framebufferBinding._4_4_;
      pAStack_60->level = texObj._4_4_;
      for (local_7c = 0; local_7c < local_44; local_7c = local_7c + 1) {
        acquireFboAttachmentReference(this,pAStack_60);
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::framebufferTexture2D (deUint32 target, deUint32 attachment, deUint32 textarget, deUint32 texture, int level)
{
	if (attachment == GL_DEPTH_STENCIL_ATTACHMENT)
	{
		// Attach to both depth and stencil.
		framebufferTexture2D(target, GL_DEPTH_ATTACHMENT,	textarget, texture, level);
		framebufferTexture2D(target, GL_STENCIL_ATTACHMENT,	textarget, texture, level);
	}
	else
	{
		Framebuffer::AttachmentPoint	point			= mapGLAttachmentPoint(attachment);
		Texture*						texObj			= DE_NULL;
		Framebuffer::TexTarget			fboTexTarget	= mapGLFboTexTarget(textarget);

		RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
					target != GL_DRAW_FRAMEBUFFER	&&
					target != GL_READ_FRAMEBUFFER,				GL_INVALID_ENUM,		RC_RET_VOID);
		RC_IF_ERROR(point == Framebuffer::ATTACHMENTPOINT_LAST,	GL_INVALID_ENUM,		RC_RET_VOID);

		// Select binding point.
		rc::Framebuffer* framebufferBinding = (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER) ? m_drawFramebufferBinding : m_readFramebufferBinding;
		RC_IF_ERROR(!framebufferBinding, GL_INVALID_OPERATION, RC_RET_VOID);

		// If framebuffer object is bound for both reading and writing then we need to acquire/release multiple references.
		int bindingRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
							+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

		if (texture != 0)
		{
			texObj = m_textures.find(texture);

			RC_IF_ERROR(!texObj,		GL_INVALID_OPERATION,	RC_RET_VOID);
			RC_IF_ERROR(level != 0,		GL_INVALID_VALUE,		RC_RET_VOID); // \todo [2012-03-19 pyry] We should allow other levels as well.

			if (texObj->getType() == Texture::TYPE_2D)
				RC_IF_ERROR(fboTexTarget != Framebuffer::TEXTARGET_2D, GL_INVALID_OPERATION, RC_RET_VOID);
			else
			{
				TCU_CHECK(texObj->getType() == Texture::TYPE_CUBE_MAP);
				if (!deInRange32(fboTexTarget, Framebuffer::TEXTARGET_CUBE_MAP_POSITIVE_X, Framebuffer::TEXTARGET_CUBE_MAP_NEGATIVE_Z))
					RC_ERROR_RET(GL_INVALID_OPERATION, RC_RET_VOID);
			}
		}

		Framebuffer::Attachment& fboAttachment = framebufferBinding->getAttachment(point);
		for (int ndx = 0; ndx < bindingRefCount; ndx++)
			releaseFboAttachmentReference(fboAttachment);
		fboAttachment = Framebuffer::Attachment();

		if (texObj)
		{
			fboAttachment.type			= Framebuffer::ATTACHMENTTYPE_TEXTURE;
			fboAttachment.name			= texObj->getName();
			fboAttachment.texTarget		= fboTexTarget;
			fboAttachment.level			= level;

			for (int ndx = 0; ndx < bindingRefCount; ndx++)
				acquireFboAttachmentReference(fboAttachment);
		}
	}
}